

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PathEllipticalArcTo
          (ImDrawList *this,ImVec2 *center,ImVec2 *radius,float rot,float a_min,float a_max,
          int num_segments)

{
  int in_ECX;
  float *in_RDX;
  float *in_RSI;
  ImVector<ImVec2> *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float in_XMM1_Da;
  float in_XMM2_Da;
  ImVec2 rel;
  ImVec2 point;
  float a;
  int i;
  float sin_rot;
  float cos_rot;
  undefined4 in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  int local_34;
  int local_28;
  
  local_28 = in_ECX;
  if (in_ECX < 1) {
    ImMax<float>(*in_RDX,in_RDX[1]);
    local_28 = _CalcCircleAutoSegmentCount
                         ((ImDrawList *)
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                          (float)((ulong)in_RDI >> 0x20));
  }
  ImVector<ImVec2>::reserve
            ((ImVector<ImVec2> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (int)in_stack_ffffffffffffffbc);
  fVar1 = cosf(in_XMM0_Da);
  fVar2 = sinf(in_XMM0_Da);
  for (local_34 = 0; local_34 <= local_28; local_34 = local_34 + 1) {
    fVar3 = ((float)local_34 / (float)local_28) * (in_XMM2_Da - in_XMM1_Da) + in_XMM1_Da;
    fVar4 = cosf(fVar3);
    fVar4 = fVar4 * *in_RDX;
    fVar3 = sinf(fVar3);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc0,fVar4,fVar3 * in_RDX[1]);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffb8,
                   in_stack_ffffffffffffffc0 * fVar1 + -(in_stack_ffffffffffffffc4 * fVar2),
                   in_stack_ffffffffffffffc0 * fVar2 + in_stack_ffffffffffffffc4 * fVar1);
    in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffb8 + *in_RSI;
    in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffbc + in_RSI[1];
    ImVector<ImVec2>::push_back(in_RDI,(ImVec2 *)CONCAT44(fVar4,in_stack_ffffffffffffffa8));
  }
  return;
}

Assistant:

void ImDrawList::PathEllipticalArcTo(const ImVec2& center, const ImVec2& radius, float rot, float a_min, float a_max, int num_segments)
{
    if (num_segments <= 0)
        num_segments = _CalcCircleAutoSegmentCount(ImMax(radius.x, radius.y)); // A bit pessimistic, maybe there's a better computation to do here.

    _Path.reserve(_Path.Size + (num_segments + 1));

    const float cos_rot = ImCos(rot);
    const float sin_rot = ImSin(rot);
    for (int i = 0; i <= num_segments; i++)
    {
        const float a = a_min + ((float)i / (float)num_segments) * (a_max - a_min);
        ImVec2 point(ImCos(a) * radius.x, ImSin(a) * radius.y);
        const ImVec2 rel((point.x * cos_rot) - (point.y * sin_rot), (point.x * sin_rot) + (point.y * cos_rot));
        point.x = rel.x + center.x;
        point.y = rel.y + center.y;
        _Path.push_back(point);
    }
}